

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int XMLNode_move_child(XMLNode *node,int from,int to)

{
  uint uVar1;
  _XMLNode *p_Var2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar3 = 0;
  if ((((node != (XMLNode *)0x0) && (-1 < from)) && (node->init_value == 0x19770522)) &&
     (uVar1 = node->n_children, from < (int)uVar1)) {
    uVar6 = 0;
    if (0 < to) {
      uVar6 = to;
    }
    uVar4 = uVar1 - 1;
    if (uVar6 < uVar1) {
      uVar4 = uVar6;
    }
    uVar5 = (ulong)(uint)from;
    p_Var2 = node->children[uVar5];
    if ((uint)from < uVar4) {
      do {
        node->children[uVar5] = node->children[uVar5 + 1];
        from = from + 1;
        uVar5 = uVar5 + 1;
      } while (from < (int)uVar4);
    }
    else if (uVar4 < (uint)from) {
      do {
        node->children[uVar5] = node->children[uVar5 - 1];
        uVar5 = uVar5 - 1;
      } while ((long)(ulong)uVar4 < (long)uVar5);
    }
    node->children[(int)uVar4] = p_Var2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int XMLNode_move_child(XMLNode* node, int from, int to)
{
	XMLNode* nfrom;

	CHECK_NODE(node, FALSE);
	if (from < 0 || from >= node->n_children)
		return FALSE;
	if (to < 0) /* Before first => first */
		to = 0;
	if (to >= node->n_children) /* After last => last */
		to = node->n_children - 1;

	nfrom = node->children[from];
	if (to > from) { /* Move forward: bring following nodes (up to 'to') backward one position */
		int i;
		for (i = from; i < to; i++)
			node->children[i] = node->children[i+1];
	} else { /* Move backward: bring previous nodes (up to 'from') forward one position */
		int i;
		for (i = from - 1; i >= to; i--)
			node->children[i+1] = node->children[i];
	}
	node->children[to] = nfrom;

	return TRUE;
}